

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O0

MPP_RET hal_task_get_hnd(HalTaskGroup group,RK_S32 status,HalTaskHnd *hnd)

{
  int iVar1;
  list_head *plVar2;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  HalTaskImpl *task;
  list_head *list;
  HalTaskGroupImpl *p;
  HalTaskHnd *hnd_local;
  RK_S32 status_local;
  HalTaskGroup group_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (((group == (HalTaskGroup)0x0) || (2 < status)) || (hnd == (HalTaskHnd *)0x0)) {
    _mpp_log_l(2,"hal_task","found invaid input group %p status %d hnd %p\n","hal_task_get_hnd",
               group,(ulong)(uint)status,hnd);
    group_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    *hnd = (HalTaskHnd)0x0;
    plVar2 = (list_head *)(*(long *)((long)group + 0x28) + (long)status * 0x10);
    mpp_spinlock_lock((spinlock_t *)((long)group + 8));
    iVar1 = list_empty(plVar2);
    if (iVar1 == 0) {
      plVar2 = plVar2->next;
      if ((*(int *)((long)&plVar2[1].prev + 4) != status) &&
         (_mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "task->status == status","hal_task_get_hnd",CONCAT44(uVar3,0x8a)),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      *hnd = plVar2;
      mpp_spinlock_unlock((spinlock_t *)((long)group + 8));
      group_local._4_4_ = MPP_OK;
    }
    else {
      mpp_spinlock_unlock((spinlock_t *)((long)group + 8));
      group_local._4_4_ = MPP_NOK;
    }
  }
  return group_local._4_4_;
}

Assistant:

MPP_RET hal_task_get_hnd(HalTaskGroup group, RK_S32 status, HalTaskHnd *hnd)
{
    if (NULL == group || status >= TASK_BUTT || NULL == hnd) {
        mpp_err_f("found invaid input group %p status %d hnd %p\n", group, status, hnd);
        return MPP_ERR_UNKNOW;
    }

    *hnd = NULL;
    HalTaskGroupImpl *p = (HalTaskGroupImpl *)group;
    struct list_head *list = &p->list[status];

    mpp_spinlock_lock(&p->lock);
    if (list_empty(list)) {
        mpp_spinlock_unlock(&p->lock);
        return MPP_NOK;
    }

    HalTaskImpl *task = list_entry(list->next, HalTaskImpl, list);
    mpp_assert(task->status == status);
    *hnd = task;
    mpp_spinlock_unlock(&p->lock);
    return MPP_OK;
}